

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

string * __thiscall
punky::lex::Lexer::tokenize_identifier_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  allocator<char> local_31;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  char *local_20;
  const_iterator ident_begin;
  Lexer *this_local;
  
  local_20 = (this->m_curr_it)._M_current;
  ident_begin._M_current = (char *)this;
  while( true ) {
    bVar1 = utils::is_letter(this->m_curr_char);
    if (!bVar1) break;
    consume(this);
  }
  local_28._M_current = local_20;
  local_30._M_current = (this->m_curr_it)._M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_28,local_30,&local_31);
  std::allocator<char>::~allocator(&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::tokenize_identifier()
{
    const auto ident_begin = m_curr_it;
    while (utils::is_letter(m_curr_char))
        consume();
    return std::string{ident_begin, m_curr_it};
}